

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O1

Polynomial<uint32_t,_double> * anon_unknown.dwarf_c8515::GeneratePolynomialUINT(void)

{
  void *pvVar1;
  long lVar2;
  Polynomial<uint32_t,_double> *in_RDI;
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_int> __l_00;
  initializer_list<unsigned_int> __l_01;
  initializer_list<unsigned_int> __l_02;
  initializer_list<unsigned_int> __l_03;
  initializer_list<unsigned_int> __l_04;
  initializer_list<unsigned_int> __l_05;
  initializer_list<unsigned_int> __l_06;
  initializer_list<unsigned_int> __l_07;
  initializer_list<unsigned_int> __l_08;
  initializer_list<unsigned_int> __l_09;
  initializer_list<unsigned_int> __l_10;
  initializer_list<unsigned_int> __l_11;
  initializer_list<unsigned_int> __l_12;
  initializer_list<unsigned_int> __l_13;
  allocator_type local_407;
  allocator_type local_406;
  allocator_type local_405;
  allocator_type local_404;
  allocator_type local_403;
  allocator_type local_402;
  allocator_type local_401;
  allocator_type local_400;
  allocator_type local_3ff;
  allocator_type local_3fe;
  allocator_type local_3fd;
  allocator_type local_3fc;
  allocator_type local_3fb;
  allocator_type local_3fa;
  allocator_type local_3f9;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_3f8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_3e0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_3c8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_3b0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_398;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_380;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_368;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_350;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_338;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_320;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_308;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_2f0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_2d8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_2c0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_2a8;
  uint local_290 [4];
  undefined1 *local_280;
  uint local_278 [8];
  undefined1 *local_258;
  uint local_250 [6];
  undefined1 *local_238;
  undefined4 local_230;
  undefined1 *local_22c;
  undefined4 local_224;
  undefined1 *local_220 [2];
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_210;
  undefined8 local_1f8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1f0;
  undefined8 local_1d8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1d0;
  undefined1 *local_1b8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1b0;
  undefined8 local_198;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_190;
  undefined8 local_178;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_170;
  undefined1 *local_158;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_150;
  undefined8 local_138;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_130;
  undefined8 local_118;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_110;
  undefined8 local_f8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_f0;
  undefined8 local_d8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_d0;
  undefined8 local_b8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_b0;
  undefined8 local_98;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_90;
  undefined8 local_78;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_70;
  undefined8 local_58;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_50;
  undefined8 local_38;
  
  local_290[3] = 1;
  __l._M_len = 1;
  __l._M_array = local_290 + 3;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_2a8,__l,&local_3f9);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_210,&local_2a8);
  local_1f8 = 0x3ff0000000000000;
  local_290[2] = 2;
  __l_00._M_len = 1;
  __l_00._M_array = local_290 + 2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_2c0,__l_00,&local_3fa);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_1f0,&local_2c0);
  local_1d8 = 0x4000000000000000;
  local_290[1] = 3;
  __l_01._M_len = 1;
  __l_01._M_array = local_290 + 1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_2d8,__l_01,&local_3fb);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_1d0,&local_2d8);
  local_1b8 = &DAT_4008000000000000;
  local_290[0] = 4;
  __l_02._M_len = 1;
  __l_02._M_array = local_290;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_2f0,__l_02,&local_3fc);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_1b0,&local_2f0);
  local_198 = 0x4010000000000000;
  local_258 = &DAT_200000001;
  __l_03._M_len = 2;
  __l_03._M_array = (iterator)&local_258;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_308,__l_03,&local_3fd);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_190,&local_308);
  local_178 = 0x4028000000000000;
  local_278[6] = 1;
  local_278[7] = 3;
  __l_04._M_len = 2;
  __l_04._M_array = local_278 + 6;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_320,__l_04,&local_3fe);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_170,&local_320);
  local_158 = &DAT_402a000000000000;
  local_278[4] = 1;
  local_278[5] = 4;
  __l_05._M_len = 2;
  __l_05._M_array = local_278 + 4;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_338,__l_05,&local_3ff);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_150,&local_338);
  local_138 = 0x402c000000000000;
  local_278[2] = 2;
  local_278[3] = 3;
  __l_06._M_len = 2;
  __l_06._M_array = local_278 + 2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_350,__l_06,&local_400);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_130,&local_350);
  local_118 = 0x4037000000000000;
  local_278[0] = 2;
  local_278[1] = 4;
  __l_07._M_len = 2;
  __l_07._M_array = local_278;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_368,__l_07,&local_401);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_110,&local_368);
  local_f8 = 0x4038000000000000;
  local_280 = &DAT_400000003;
  __l_08._M_len = 2;
  __l_08._M_array = (iterator)&local_280;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_380,__l_08,&local_402);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_f0,&local_380);
  local_d8 = 0x4041000000000000;
  local_22c = &DAT_200000001;
  local_224 = 3;
  __l_09._M_len = 3;
  __l_09._M_array = (iterator)&local_22c;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_398,__l_09,&local_403);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_d0,&local_398);
  local_b8 = 0x405ec00000000000;
  local_238 = &DAT_200000001;
  local_230 = 4;
  __l_10._M_len = 3;
  __l_10._M_array = (iterator)&local_238;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_3b0,__l_10,&local_404);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_b0,&local_3b0);
  local_98 = 0x405f000000000000;
  local_250[3] = 1;
  local_250[4] = 3;
  local_250[5] = 4;
  __l_11._M_len = 3;
  __l_11._M_array = local_250 + 3;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_3c8,__l_11,&local_405);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_90,&local_3c8);
  local_78 = 0x4060c00000000000;
  local_250[0] = 2;
  local_250[1] = 3;
  local_250[2] = 4;
  __l_12._M_len = 3;
  __l_12._M_array = local_250;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_3e0,__l_12,&local_406);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_70,&local_3e0);
  local_58 = 0x406d400000000000;
  local_220[0] = &DAT_200000001;
  local_220[1] = &DAT_400000003;
  __l_13._M_len = 4;
  __l_13._M_array = (iterator)local_220;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_3f8,__l_13,&local_407);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_50,&local_3f8);
  local_38 = 0x4093480000000000;
  std::
  _Hashtable<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::pair<std::vector<unsigned_int,std::allocator<unsigned_int>>const,double>,std::allocator<std::pair<std::vector<unsigned_int,std::allocator<unsigned_int>>const,double>>,std::__detail::_Select1st,std::equal_to<std::vector<unsigned_int,std::allocator<unsigned_int>>>,cimod::vector_hash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_Hashtable<std::pair<std::vector<unsigned_int,std::allocator<unsigned_int>>const,double>const*>
            ();
  lVar2 = 0x1e0;
  do {
    pvVar1 = *(void **)((long)&local_230 + lVar2);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,*(long *)((long)local_220 + lVar2) - (long)pvVar1);
    }
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != 0);
  if (local_3f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_3f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_3f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_3e0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3e0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_3e0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_3e0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_3c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_3c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_3c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_3b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_3b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_3b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_398.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_398.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_398.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_398.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_380.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_380.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_380.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_380.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_368.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_368.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_368.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_368.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_350.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_350.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_350.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_350.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_338.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_338.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_338.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_338.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_320.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_320.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_320.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_320.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_308.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_308.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_308.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_308.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2f0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2f0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_2f0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2f0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_2d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_2c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_2a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return in_RDI;
}

Assistant:

Polynomial<uint32_t, double> GeneratePolynomialUINT() {
   
   Polynomial<uint32_t, double> polynomial {
      //linear biases
      {{1}, 1.0}, {{2}, 2.0}, {{3}, 3.0}, {{4}, 4.0},
      //quadratic biases
      {{1, 2}, 12.0}, {{1, 3}, 13.0}, {{1, 4}, 14.0},
      {{2, 3}, 23.0}, {{2, 4}, 24.0},
      {{3, 4}, 34.0},
      //polynomial biases
      {{1, 2, 3}, 123.0}, {{1, 2, 4}, 124.0}, {{1, 3, 4}, 134.0},
      {{2, 3, 4}, 234.0},
      {{1, 2, 3, 4}, 1234.0}
   };
   
   return polynomial;
}